

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

void __thiscall Shader::fix_version(Shader *this,string *code)

{
  undefined8 uVar1;
  char *pcVar2;
  string *psVar3;
  size_t endl;
  allocator<char> local_39;
  string local_38 [8];
  string ver_str;
  string *code_local;
  Shader *this_local;
  
  ver_str.field_2._8_8_ = code;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"#version 330",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::operator+=(local_38," core");
  pcVar2 = (char *)std::__cxx11::string::operator[](ver_str.field_2._8_8_);
  if (*pcVar2 == '#') {
    psVar3 = (string *)std::__cxx11::string::find((char)ver_str.field_2._8_8_,10);
    uVar1 = ver_str.field_2._8_8_;
    if (psVar3 == (string *)0xffffffffffffffff) {
      psVar3 = (string *)std::__cxx11::string::length();
      std::__cxx11::string::replace(uVar1,0,psVar3);
    }
    else {
      std::__cxx11::string::replace(ver_str.field_2._8_8_,0,psVar3);
    }
  }
  else {
    std::__cxx11::string::operator+=(local_38,'\n');
    std::__cxx11::string::replace(ver_str.field_2._8_8_,0,(string *)0x0);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Shader::fix_version(std::string& code)
{
    std::string ver_str = GLSL_VERSION_STR;
    ver_str += GLSL_PROFILE;

    // Version string is present -> need to set to current version
    if (code[0] == '#')
    {
        // Replace until end of the line
        size_t endl = code.find('\n');
        if (endl != std::string::npos)
            code.replace(0, endl, ver_str);
        else
            code.replace(0, ver_str.length(), ver_str);
    }
    else
    {
        // Prepend the version string
        ver_str += '\n';
        code.replace(0, 0, ver_str);
    }
}